

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Voice::noteOn(V2Voice *this,int note,int vel)

{
  int iVar1;
  int local_34;
  int local_30;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int vel_local;
  int note_local;
  V2Voice *this_local;
  
  this->note = note;
  updateNote(this);
  this->velo = (float)vel;
  this->gate = true;
  for (i_2 = 0; i_2 < 2; i_2 = i_2 + 1) {
    this->env[i_2].state = ATTACK;
  }
  iVar1 = this->keysync;
  if (iVar1 != 0) {
    if (iVar1 != 1) {
      if (iVar1 != 2) goto LAB_001116a7;
      for (i_3 = 0; i_3 < 2; i_3 = i_3 + 1) {
        this->env[i_3].val = 0.0;
      }
      this->curvol = 0.0;
      for (i_4 = 0; i_4 < 3; i_4 = i_4 + 1) {
        V2Osc::init(this->osc + i_4,(EVP_PKEY_CTX *)this->inst);
      }
      for (i_5 = 0; i_5 < 2; i_5 = i_5 + 1) {
        V2Flt::init(this->vcf + i_5,(EVP_PKEY_CTX *)this->inst);
      }
      V2Dist::init(&this->dist,(EVP_PKEY_CTX *)this->inst);
    }
    for (i_6 = 0; i_6 < 3; i_6 = i_6 + 1) {
      this->osc[i_6].cnt = 0;
    }
  }
LAB_001116a7:
  for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
    V2Osc::chgPitch(this->osc + local_30);
  }
  for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
    V2LFO::keyOn(this->lfo + local_34);
  }
  V2DCFilter::init(&this->dcf,(EVP_PKEY_CTX *)this->inst);
  return;
}

Assistant:

void noteOn(int note, int vel)
    {
        this->note = note;
        updateNote();

        velo = (float)vel;
        gate = true;

        // reset EGs
        for (int i=0; i < syVV2::NENV; i++)
            env[i].state = V2Env::ATTACK;

        // process sync
        switch (keysync)
        {
        case SYNC_FULL:
            COVER("VOICE noteOn sync full");
            for (int i=0; i < syVV2::NENV; i++)
                env[i].val = 0.0f;
            curvol = 0.0f;

            for (int i=0; i < syVV2::NOSC; i++)
                osc[i].init(inst, i);

            for (int i=0; i < syVV2::NFLT; i++)
                vcf[i].init(inst);

            dist.init(inst);
            // fall-through

        case SYNC_OSC:
            COVER("VOICE noteOn sync osc");
            for (int i=0; i < syVV2::NOSC; i++)
                osc[i].cnt = 0;
            // fall-through

        case SYNC_NONE:
        default:
            break;
        }

        for (int i=0; i < syVV2::NOSC; i++)
            osc[i].chgPitch();

        for (int i=0; i < syVV2::NLFO; i++)
            lfo[i].keyOn();

        dcf.init(inst);
    }